

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O2

double PAL_wcstod(char16_t *nptr,char16_t **endptr)

{
  char16_t cVar1;
  int iVar2;
  char *lpMultiByteStr;
  uint cbMultiByte;
  char16_t *lpWideCharStr;
  ulong uVar3;
  char16_t *pcVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  char *local_50;
  LPSTR ScanStop;
  char16_t **local_40;
  char16_t *local_38;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00312d77;
  if (nptr == (char16_t *)0x0) {
    uVar5 = 0;
    uVar6 = 0;
    goto LAB_00312d1e;
  }
  lpWideCharStr = nptr + -1;
  local_40 = endptr;
  local_38 = nptr;
  do {
    pcVar4 = lpWideCharStr + 1;
    lpWideCharStr = lpWideCharStr + 1;
    iVar2 = PAL_iswspace(*pcVar4);
  } while (iVar2 != 0);
  uVar3 = 0;
  for (pcVar4 = lpWideCharStr;
      ((cVar1 = *pcVar4, (ushort)cVar1 - 0x2d < 2 || (cVar1 == L'+')) ||
      ((cVar1 != L'\0' && (((ushort)(cVar1 + L'￐') < 10 || ((cVar1 + L'ﾼ' & 0xffdeU) == 0))))));
      pcVar4 = pcVar4 + 1) {
    uVar3 = uVar3 + 2;
  }
  if (uVar3 == 0) {
LAB_00312ce7:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00312d77;
    lpMultiByteStr = (char *)0x0;
LAB_00312cf7:
    uVar6 = 0;
    uVar5 = 0;
    pcVar4 = local_38;
  }
  else {
    iVar2 = (int)(uVar3 >> 1);
    cbMultiByte = iVar2 + 1;
    lpMultiByteStr = (char *)PAL_malloc((ulong)cbMultiByte);
    if (lpMultiByteStr == (char *)0x0) goto LAB_00312ce7;
    iVar2 = WideCharToMultiByte(0,0,lpWideCharStr,iVar2,lpMultiByteStr,cbMultiByte,(LPCSTR)0x0,
                                (LPBOOL)0x0);
    if (iVar2 == 0) {
      fprintf(_stderr,"] %s %s:%d","PAL_wcstod",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/wchar.cpp"
              ,0x6b1);
      fprintf(_stderr,"Wide char to multibyte conversion failed.\n");
      goto LAB_00312cf7;
    }
    local_50 = (char *)0x0;
    lpMultiByteStr[uVar3 >> 1 & 0xffffffff] = '\0';
    ScanStop = (LPSTR)strtod(lpMultiByteStr,&local_50);
    uVar5 = SUB84(ScanStop,0);
    uVar6 = (undefined4)((ulong)ScanStop >> 0x20);
    if ((((double)ScanStop == 0.0) && (!NAN((double)ScanStop))) && (local_50 == lpMultiByteStr)) {
      fprintf(_stderr,"] %s %s:%d","PAL_wcstod",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/wchar.cpp"
              ,0x6ab);
      fprintf(_stderr,"An error occurred in the conversion.\n");
      uVar5 = SUB84(ScanStop,0);
      uVar6 = (undefined4)((ulong)ScanStop >> 0x20);
      pcVar4 = local_38;
    }
  }
  ScanStop = (LPSTR)CONCAT44(uVar6,uVar5);
  if (local_40 != (char16_t **)0x0) {
    *local_40 = pcVar4;
  }
  PAL_free(lpMultiByteStr);
  uVar5 = SUB84(ScanStop,0);
  uVar6 = (undefined4)((ulong)ScanStop >> 0x20);
  if (PAL_InitializeChakraCoreCalled != false) {
LAB_00312d1e:
    return (double)CONCAT44(uVar6,uVar5);
  }
LAB_00312d77:
  abort();
}

Assistant:

double
__cdecl
PAL_wcstod( const char16_t * nptr, char16_t **endptr )
{
    double RetVal = 0.0;
    LPSTR  lpStringRep = NULL;
    LPWSTR lpStartOfExpression = (LPWSTR)nptr;
    LPWSTR lpEndOfExpression = NULL;
    UINT Length = 0;

    PERF_ENTRY(wcstod);
    ENTRY( "wcstod( %p (%S), %p (%S) )\n", nptr, nptr, endptr , endptr );

    if ( !nptr )
    {
        ERROR( "nptr is invalid.\n" );
        LOGEXIT( "wcstod returning 0.0\n" );
        PERF_EXIT(wcstod);
        return 0.0;
    }

    /* Eat white space. */
    while ( PAL_iswspace( *lpStartOfExpression ) )
    {
        lpStartOfExpression++;
    }

    /* Get the end of the expression. */
    lpEndOfExpression = lpStartOfExpression;
    while ( *lpEndOfExpression )
    {
        if ( !MISC_CRT_WCSTOD_IsValidCharacter( *lpEndOfExpression ) )
        {
            break;
        }
        lpEndOfExpression++;
    }

    if ( lpEndOfExpression != lpStartOfExpression )
    {
        Length = lpEndOfExpression - lpStartOfExpression;
        lpStringRep = (LPSTR)PAL_malloc( Length + 1);

        if ( lpStringRep )
        {
            if ( WideCharToMultiByte( CP_ACP, 0, lpStartOfExpression, Length,
                                      lpStringRep, Length + 1 ,
                                      NULL, 0 ) != 0 )
            {
                LPSTR ScanStop = NULL;
                lpStringRep[Length]= 0;
                RetVal = strtod( lpStringRep, &ScanStop );

                /* See if strtod failed. */
                if ( RetVal == 0.0 && ScanStop == lpStringRep )
                {
                    ASSERT( "An error occurred in the conversion.\n" );
                    lpEndOfExpression = (LPWSTR)nptr;
                }
            }
            else
            {
                ASSERT( "Wide char to multibyte conversion failed.\n" );
                lpEndOfExpression = (LPWSTR)nptr;
            }
        }
        else
        {
            ERROR( "Not enough memory.\n" );
            lpEndOfExpression = (LPWSTR)nptr;
        }
    }
    else
    {
        ERROR( "Malformed expression.\n" );
        lpEndOfExpression = (LPWSTR)nptr;
    }

    /* Set the stop scan character. */
    if ( endptr != NULL )
    {
        *endptr = lpEndOfExpression;
    }

    PAL_free( lpStringRep );
    LOGEXIT( "wcstod returning %f.\n", RetVal );
    PERF_EXIT(wcstod);
    return RetVal;
}